

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

char * __thiscall FCommandLine::operator[](FCommandLine *this,int i)

{
  int iVar1;
  ulong uVar2;
  char **ppcVar3;
  
  ppcVar3 = this->_argv;
  if (ppcVar3 == (char **)0x0) {
    iVar1 = argc(this);
    uVar2 = (this->argsize + 7U >> 3) + (long)iVar1;
    ppcVar3 = (char **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    this->_argv = ppcVar3;
    *ppcVar3 = (char *)(ppcVar3 + iVar1);
    ParseCommandLine(this->cmd,(int *)0x0,ppcVar3,this->noescapes);
    ppcVar3 = this->_argv;
  }
  return ppcVar3[i];
}

Assistant:

char *FCommandLine::operator[] (int i)
{
	if (_argv == NULL)
	{
		int count = argc();
		_argv = new char *[count + (argsize+sizeof(char*)-1)/sizeof(char*)];
		_argv[0] = (char *)_argv + count*sizeof(char *);
		ParseCommandLine (cmd, NULL, _argv, noescapes);
	}
	return _argv[i];
}